

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memjrnlRead(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  bool bVar1;
  int local_60;
  int nCopy;
  int iSpace;
  sqlite3_int64 iOff;
  FileChunk *pChunk;
  int iChunkOffset;
  int nRead;
  u8 *zOut;
  MemJournal *p;
  sqlite_int64 iOfst_local;
  int iAmt_local;
  void *zBuf_local;
  sqlite3_file *pJfd_local;
  
  if ((pJfd[4].pMethods == (sqlite3_io_methods *)iOfst) && (iOfst != 0)) {
    iOff = (sqlite3_int64)pJfd[5].pMethods;
  }
  else {
    _nCopy = 0;
    for (iOff = (sqlite3_int64)pJfd[1].pMethods; iOff != 0 && _nCopy + 0x3f8 <= iOfst;
        iOff = *(sqlite3_int64 *)iOff) {
      _nCopy = _nCopy + 0x3f8;
    }
  }
  pChunk._0_4_ = (int)(iOfst % 0x3f8);
  pChunk._4_4_ = iAmt;
  _iChunkOffset = zBuf;
  do {
    if (pChunk._4_4_ < 0x3f8 - (int)pChunk) {
      local_60 = pChunk._4_4_;
    }
    else {
      local_60 = 0x3f8 - (int)pChunk;
    }
    memcpy(_iChunkOffset,(void *)(iOff + 8 + (long)(int)pChunk),(long)local_60);
    _iChunkOffset = (void *)((long)_iChunkOffset + (long)local_60);
    pChunk._4_4_ = pChunk._4_4_ - (0x3f8 - (int)pChunk);
    pChunk._0_4_ = 0;
    bVar1 = false;
    if (-1 < pChunk._4_4_) {
      iOff = *(sqlite3_int64 *)iOff;
      bVar1 = false;
      if (iOff != 0) {
        bVar1 = 0 < pChunk._4_4_;
      }
    }
  } while (bVar1);
  pJfd[4].pMethods = (sqlite3_io_methods *)(iOfst + iAmt);
  pJfd[5].pMethods = (sqlite3_io_methods *)iOff;
  return 0;
}

Assistant:

static int memjrnlRead(
  sqlite3_file *pJfd,    /* The journal file from which to read */
  void *zBuf,            /* Put the results here */
  int iAmt,              /* Number of bytes to read */
  sqlite_int64 iOfst     /* Begin reading at this offset */
){
  MemJournal *p = (MemJournal *)pJfd;
  u8 *zOut = zBuf;
  int nRead = iAmt;
  int iChunkOffset;
  FileChunk *pChunk;

  /* SQLite never tries to read past the end of a rollback journal file */
  assert( iOfst+iAmt<=p->endpoint.iOffset );

  if( p->readpoint.iOffset!=iOfst || iOfst==0 ){
    sqlite3_int64 iOff = 0;
    for(pChunk=p->pFirst; 
        ALWAYS(pChunk) && (iOff+JOURNAL_CHUNKSIZE)<=iOfst;
        pChunk=pChunk->pNext
    ){
      iOff += JOURNAL_CHUNKSIZE;
    }
  }else{
    pChunk = p->readpoint.pChunk;
  }

  iChunkOffset = (int)(iOfst%JOURNAL_CHUNKSIZE);
  do {
    int iSpace = JOURNAL_CHUNKSIZE - iChunkOffset;
    int nCopy = MIN(nRead, (JOURNAL_CHUNKSIZE - iChunkOffset));
    memcpy(zOut, &pChunk->zChunk[iChunkOffset], nCopy);
    zOut += nCopy;
    nRead -= iSpace;
    iChunkOffset = 0;
  } while( nRead>=0 && (pChunk=pChunk->pNext)!=0 && nRead>0 );
  p->readpoint.iOffset = iOfst+iAmt;
  p->readpoint.pChunk = pChunk;

  return SQLITE_OK;
}